

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O2

void QPDFCryptoProvider::registerImpl(string *name,provider_fn *f)

{
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  getInstance();
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = f->_M_invoker;
  p_Var1 = (f->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(f->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(f->super__Function_base)._M_functor + 8);
    (f->super__Function_base)._M_manager = (_Manager_type)0x0;
    f->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  registerImpl_internal(&getInstance::instance,name,(provider_fn *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

void
QPDFCryptoProvider::registerImpl(std::string const& name, provider_fn f)
{
    getInstance().registerImpl_internal(name, std::move(f));
}